

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_v4l2.h
# Opt level: O0

v4l2_format *
util_v4l2::get_current_format(v4l2_format *__return_storage_ptr__,int fd,error_code *err)

{
  int iVar1;
  error_code *err_local;
  int fd_local;
  
  if (err != (error_code *)0x0) {
    *err = ERR_NO_ERROR;
  }
  __return_storage_ptr__->type = 1;
  iVar1 = xioctl(fd,-0x3f2fa9fc,__return_storage_ptr__);
  if ((iVar1 == -1) && (err != (error_code *)0x0)) {
    *err = ERR_VIDIOC_G_FMT;
  }
  return __return_storage_ptr__;
}

Assistant:

v4l2_format get_current_format(int fd, error_code *err) {
        SET_ERR_CODE(err, error_code::ERR_NO_ERROR);

        v4l2_format format;
        format.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;

        if (-1 == util_v4l2::xioctl(fd, VIDIOC_G_FMT, &format)) {

            SET_ERR_CODE(err, error_code::ERR_VIDIOC_G_FMT);

        }
        return format;
    }